

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void encode_fixedarray(upb_encstate *e,upb_Array *arr,size_t elem_size,uint32_t tag)

{
  undefined4 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  void *data;
  long lVar5;
  size_t len;
  
  len = arr->size_dont_copy_me__upb_internal_use_only * elem_size;
  data = (void *)(arr->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  if (tag == 0) {
    encode_bytes(e,data,len);
    return;
  }
  if ((elem_size != 8) && (elem_size != 4)) {
    __assert_fail("elem_size == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/wire/encode.c"
                  ,0xcc,
                  "void encode_fixedarray(upb_encstate *, const upb_Array *, size_t, uint32_t)");
  }
  lVar4 = (arr->size_dont_copy_me__upb_internal_use_only - 1) * elem_size;
  lVar5 = 0;
  do {
    if (elem_size == 4) {
      uVar1 = *(undefined4 *)((long)data + lVar5 + lVar4);
      if ((ulong)((long)e->ptr - (long)e->buf) < 4) {
        encode_growbuffer(e,4);
      }
      else {
        e->ptr = e->ptr + -4;
      }
      *(undefined4 *)e->ptr = uVar1;
    }
    else {
      uVar2 = *(undefined8 *)((long)data + lVar5 + lVar4);
      if ((ulong)((long)e->ptr - (long)e->buf) < 8) {
        encode_growbuffer(e,8);
      }
      else {
        e->ptr = e->ptr + -8;
      }
      *(undefined8 *)e->ptr = uVar2;
    }
    if ((tag < 0x80) && (pcVar3 = e->ptr, pcVar3 != e->buf)) {
      e->ptr = pcVar3 + -1;
      pcVar3[-1] = (char)tag;
    }
    else {
      encode_longvarint(e,(ulong)tag);
    }
    lVar5 = lVar5 - elem_size;
  } while (-lVar5 != len);
  return;
}

Assistant:

static void encode_fixedarray(upb_encstate* e, const upb_Array* arr,
                              size_t elem_size, uint32_t tag) {
  size_t bytes = upb_Array_Size(arr) * elem_size;
  const char* data = upb_Array_DataPtr(arr);
  const char* ptr = data + bytes - elem_size;

  if (tag || !upb_IsLittleEndian()) {
    while (true) {
      if (elem_size == 4) {
        uint32_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian32(val);
        encode_bytes(e, &val, elem_size);
      } else {
        UPB_ASSERT(elem_size == 8);
        uint64_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian64(val);
        encode_bytes(e, &val, elem_size);
      }

      if (tag) encode_varint(e, tag);
      if (ptr == data) break;
      ptr -= elem_size;
    }
  } else {
    encode_bytes(e, data, bytes);
  }
}